

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

bool __thiscall GF2::VSubst<8UL>::Next(VSubst<8UL> *this)

{
  WW<8UL> *wRight;
  Func<8UL,_GF2::WW<8UL>_> *in_RDI;
  word j;
  word i;
  WW<8UL> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar1;
  undefined7 in_stack_ffffffffffffffd0;
  bool bVar2;
  undefined1 uVar3;
  VSubst<8UL> *this_00;
  VSubst<8UL> *pVVar4;
  VSubst<8UL> *local_18;
  bool local_1;
  
  local_18 = (VSubst<8UL> *)0xfe;
  while( true ) {
    bVar2 = false;
    if (local_18 != (VSubst<8UL> *)0xffffffffffffffff) {
      Func<8UL,_GF2::WW<8UL>_>::Get(in_RDI,(word)local_18);
      Func<8UL,_GF2::WW<8UL>_>::Get
                (in_RDI,(word)((long)(local_18->super_VFunc<8UL,_8UL>).
                                     super_Func<8UL,_GF2::WW<8UL>_>._vals[0]._words + 1));
      bVar2 = WW<8ul>::operator>((WW<8UL> *)
                                 CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffb8);
    }
    if (bVar2 == false) break;
    local_18 = (VSubst<8UL> *)
               ((long)local_18[-1].super_VFunc<8UL,_8UL>.super_Func<8UL,_GF2::WW<8UL>_>._vals[0xff].
                      _words + 7);
  }
  if (local_18 == (VSubst<8UL> *)0xffffffffffffffff) {
    First((VSubst<8UL> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    local_1 = false;
  }
  else {
    uVar3 = 0;
    pVVar4 = local_18;
    do {
      this_00 = (VSubst<8UL> *)
                ((long)(pVVar4->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[0].
                       _words + 1);
      uVar1 = false;
      if ((undefined1 *)
          ((long)(pVVar4->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[0]._words + 2U
          ) < (undefined1 *)0x100) {
        wRight = Func<8UL,_GF2::WW<8UL>_>::Get
                           (in_RDI,(word)((long)(pVVar4->super_VFunc<8UL,_8UL>).
                                                super_Func<8UL,_GF2::WW<8UL>_>._vals[0]._words + 2))
        ;
        Func<8UL,_GF2::WW<8UL>_>::Get(in_RDI,(word)local_18);
        uVar1 = WW<8ul>::operator>((WW<8UL> *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),wRight);
      }
      pVVar4 = this_00;
    } while ((bool)uVar1 != false);
    Transpose(this_00,(word)in_RDI,CONCAT17(uVar3,in_stack_ffffffffffffffd0));
    pVVar4 = (VSubst<8UL> *)0x100;
    while( true ) {
      local_18 = (VSubst<8UL> *)
                 ((long)(local_18->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[0].
                        _words + 1);
      pVVar4 = (VSubst<8UL> *)
               ((long)pVVar4[-1].super_VFunc<8UL,_8UL>.super_Func<8UL,_GF2::WW<8UL>_>._vals[0xff].
                      _words + 7);
      if (pVVar4 <= local_18) break;
      Transpose(pVVar4,(word)in_RDI,CONCAT17(uVar3,in_stack_ffffffffffffffd0));
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Next()
	{
		// ищем с конца убывающую цепочку
		word i = _size - 2;
		while (i != WORD_MAX && Get(i) > Get(i + 1)) i--;
		// достигли начала, т.е. последняя подстановка?
		if (i == WORD_MAX)
		{
			First();
			return false;
		}
		// здесь s[i] < s[i + 1] > .... > s[_size - 1]
		word j = i + 1;
		while (j + 1 < _size && Get(j + 1) > Get(i)) j++;
		// теперь s[i] < s[j] и s[i] > s[j + 1]
		// выполняем транспозиции
		Transpose(i, j);
		j = _size;
		while (++i < --j)
			Transpose(i, j);
		// не последняя подстановка 
		return true;
	}